

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.h
# Opt level: O1

Value * __thiscall flow::Runner::Stack::operator[](Stack *this,int relativeIndex)

{
  pointer puVar1;
  long lVar2;
  void *pvVar3;
  Value *pVVar4;
  unsigned_long *puVar5;
  long lVar6;
  size_t __n;
  undefined4 in_register_00000034;
  
  pVVar4 = (Value *)CONCAT44(in_register_00000034,relativeIndex);
  if (relativeIndex < 0) {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    this = (Stack *)(lVar6 >> 3);
    if (this <= (new_allocator<unsigned_long> *)(ulong)(uint)~relativeIndex) goto LAB_001646b1;
    pVVar4 = (Value *)((long)puVar1 + (long)relativeIndex * 8 + lVar6);
  }
  else {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stack_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)(uint)relativeIndex) {
      operator[]();
LAB_001646b1:
      operator[]();
      puVar1 = *(pointer *)((long)this + 8);
      if (puVar1 != *(pointer *)this) {
        pVVar4 = (Value *)puVar1[-1];
        *(pointer *)((long)this + 8) = puVar1 + -1;
        return pVVar4;
      }
      pop();
      if ((ulong)pVVar4 >> 0x3c == 0) {
        lVar6 = *(long *)this;
        puVar5 = (unsigned_long *)(*(long *)((long)this + 0x10) - lVar6 >> 3);
        if (puVar5 < pVVar4) {
          lVar2 = *(long *)((long)this + 8);
          puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                             ((new_allocator<unsigned_long> *)this,(size_type)pVVar4,(void *)0x0);
          __n = *(long *)((long)this + 8) - (long)*(void **)this;
          if (0 < (long)__n) {
            memmove(puVar5,*(void **)this,__n);
          }
          pvVar3 = *(void **)this;
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,*(long *)((long)this + 0x10) - (long)pvVar3);
          }
          *(unsigned_long **)this = puVar5;
          *(long *)((long)this + 8) = (lVar2 - lVar6) + (long)puVar5;
          puVar5 = puVar5 + (long)pVVar4;
          *(unsigned_long **)((long)this + 0x10) = puVar5;
        }
        return puVar5;
      }
      std::__throw_length_error("vector::reserve");
    }
    pVVar4 = puVar1 + (uint)relativeIndex;
  }
  return pVVar4;
}

Assistant:

Value& operator[](int relativeIndex) {
      if (relativeIndex < 0) {
        FLOW_ASSERT(static_cast<size_t>(-relativeIndex - 1) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[stack_.size() + relativeIndex];
      } else {
        FLOW_ASSERT(static_cast<size_t>(relativeIndex) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[relativeIndex];
      }
    }